

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O0

void __thiscall
Animation_Constraint::Changed
          (Animation_Constraint *this,Am_Slot *slot,Am_Constraint *invalidating_constraint,
          Am_Value *param_3,Am_Value *new_value)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Explicit_Set *pAVar3;
  Am_Slot local_70;
  undefined1 local_61;
  ulong uStack_60;
  bool running;
  Am_Slot_Flags flags;
  byte local_4d;
  bool animated;
  Am_Demon_Queue local_40;
  Am_Demon_Queue queue;
  Am_Object_Advanced object;
  Am_Value *new_value_local;
  Am_Value *param_3_local;
  Am_Constraint *invalidating_constraint_local;
  Am_Slot *slot_local;
  Animation_Constraint *this_local;
  
  Am_Slot::Get_Owner((Am_Slot *)&queue);
  Am_Object_Advanced::Get_Queue((Am_Object_Advanced *)&local_40);
  Am_Demon_Queue::Prevent_Invoke(&local_40);
  if ((Animation_Constraint *)invalidating_constraint != this) {
    if ((this->must_initialize_instance & 1U) != 0) {
      Initialize(this);
    }
    flags = (Am_Slot_Flags)Am_Object_Advanced::Get_Slot(&this->interpolator,0xcc);
    pAVar2 = Am_Slot::Get((Am_Slot *)&flags);
    local_4d = Am_Value::Valid(pAVar2);
    if ((invalidating_constraint != (Am_Constraint *)0x0) &&
       (bVar1 = Am_Explicit_Set::Test(invalidating_constraint), bVar1)) {
      pAVar3 = Am_Explicit_Set::Narrow(invalidating_constraint);
      uStack_60 = pAVar3->flags;
      if ((uStack_60 & 0x40000) == 0) {
        if ((uStack_60 & 0x20000) == 0) {
          if ((uStack_60 & 0x80000) != 0) goto LAB_002080b1;
        }
        else {
          local_4d = 0;
        }
      }
      else {
        local_4d = 1;
      }
    }
    local_70 = Am_Object_Advanced::Get_Slot(&this->interpolator,0xf7);
    pAVar2 = Am_Slot::Get(&local_70);
    local_61 = Am_Value::Valid(pAVar2);
    if (((bool)local_61) && ((local_4d & 1) == 0)) {
      this->must_abort_animation = true;
    }
    if ((((bool)local_61) || ((local_4d & 1) != 0)) && ((this->change_enqueued & 1U) == 0)) {
      this->change_enqueued = true;
      Am_Demon_Queue::Enqueue(&local_40,animator_changed_demon,0,slot);
      Am_Value::operator=(&this->start,&this->target);
    }
    Set_Target_Value(this,slot,new_value);
    if ((local_4d & 1) == 0) {
      Am_Value::operator=(&this->start,&this->target);
    }
  }
LAB_002080b1:
  Am_Demon_Queue::Release_Invoke(&local_40);
  Am_Demon_Queue::~Am_Demon_Queue(&local_40);
  Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&queue);
  return;
}

Assistant:

void
Animation_Constraint::Changed(const Am_Slot &slot,
                              Am_Constraint *invalidating_constraint,
                              const Am_Value &, const Am_Value &new_value)
{
  Am_Object_Advanced object = slot.Get_Owner();
  Am_Demon_Queue queue = object.Get_Queue();

  queue.Prevent_Invoke();
  // MUST Release_Invoke(), SO DON'T RETURN -- use "goto done" instead

  // std::cout << "Animation_Constraint::Changed " << slot.Get_Key() << ", " <<
  //  invalidating_constraint << ", new value " << new_value <<std::endl;
  if (invalidating_constraint != this) {
    if (must_initialize_instance)
      Initialize();

    // animated: should this change should be animated?
    bool animated = interpolator.Get_Slot(Am_ACTIVE).Get().Valid();
    //bool animated = interpolator.Get (Am_ACTIVE, Am_RETURN_ZERO_ON_ERROR);

    if (invalidating_constraint &&
        Am_Explicit_Set::Test(invalidating_constraint)) {
      Am_Slot_Flags flags =
          Am_Explicit_Set::Narrow(invalidating_constraint)->flags;

      if (flags & Am_WITH_ANIMATION)
        animated = true;
      else if (flags & Am_NO_ANIMATION)
        animated = false;
      else if (flags & Am_DONT_TELL_ANIMATORS)
        goto done; // setter doesn't want us to know (FIX: this could
      // cause inconsistency between animators' Am_VALUE and the slot value)
    }

    // running: is the animator currently running?
    bool running = interpolator.Get_Slot(Am_RUNNING).Get().Valid();
    //bool running = interpolator.Get (Am_RUNNING, Am_RETURN_ZERO_ON_ERROR);

    if (running && !animated)
      // unanimated change which may have to abort a running animation
      must_abort_animation = true;

    if ((running || animated) && !change_enqueued) {
      // put a demon on the queue which will eventually send this change
      // to the animator (unless such a demon is already there)
      change_enqueued = true;
      queue.Enqueue(animator_changed_demon, 0, slot);
      // The which_bit parameter for Enqueue is zero so that
      // when the demon is called it won't affect the demon_bits
      // in the slot.

      // this is the first change (of possibly a series of Sets affecting
      // this constraint).  Initialize the starting value.
      start = target;
    }

    Set_Target_Value(slot, new_value);
    if (!animated)
      start = target;
  }

done:
  queue.Release_Invoke();
}